

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O1

int __thiscall
Fl_File_Browser_Type::textstuff(Fl_File_Browser_Type *this,int w,Fl_Font *f,int *s,Fl_Color *c)

{
  Fl_Fontsize newSize;
  Fl_Browser *this_00;
  int iVar1;
  
  if (w == 4) {
    this = (Fl_File_Browser_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.factory;
  }
  if ((uint)w < 5) {
    this_00 = (Fl_Browser *)((Fl_Type *)((long)this + 0x78))->prev;
    switch(w) {
    default:
      *f = (this_00->super_Fl_Browser_).textfont_;
      *s = (this_00->super_Fl_Browser_).textsize_;
      *c = (this_00->super_Fl_Browser_).textcolor_;
      break;
    case 1:
      (this_00->super_Fl_Browser_).textfont_ = *f;
      break;
    case 2:
      newSize = *s;
      Fl_Browser::textsize(this_00,newSize);
      iVar1 = newSize * 3;
      *(char *)&this_00[1].super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.parent_ =
           (char)((uint)(iVar1 - (iVar1 >> 0x1f)) >> 1);
      break;
    case 3:
      (this_00->super_Fl_Browser_).textcolor_ = *c;
    }
  }
  return 1;
}

Assistant:

int Fl_File_Browser_Type::textstuff(int w, Fl_Font& f, int& s, Fl_Color& c) {
  Fl_File_Browser *myo = (Fl_File_Browser*)(w==4 ? ((Fl_Widget_Type*)factory)->o : o);
  switch (w) {
    case 4:
    case 0: f = myo->textfont(); s = myo->textsize(); c = myo->textcolor(); break;
    case 1: myo->textfont(f); break;
    case 2: myo->textsize(s); break;
    case 3: myo->textcolor(c); break;
  }
  return 1;
}